

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::ShaderMatrixCase::ShaderMatrixCase
          (ShaderMatrixCase *this,Context *context,char *name,char *desc,ShaderInput *in0,
          ShaderInput *in1,MatrixOp op,bool isVertexCase)

{
  InputType IVar1;
  InputType IVar2;
  DataType DVar3;
  MatrixShaderEvalFunc p_Var4;
  
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderMatrixCase_00d20da8;
  deqp::gls::ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,context->m_testCtx,context->m_renderCtx,
             context->m_contextInfo,name,desc,isVertexCase,
             &(this->m_matEvaluator).super_ShaderEvaluator);
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderMatrixCase_00d20da8;
  DVar3 = in0->dataType;
  (this->m_in0).inputType = in0->inputType;
  (this->m_in0).dataType = DVar3;
  (this->m_in0).precision = in0->precision;
  DVar3 = in1->dataType;
  (this->m_in1).inputType = in1->inputType;
  (this->m_in1).dataType = DVar3;
  (this->m_in1).precision = in1->precision;
  this->m_op = op;
  p_Var4 = MatrixCaseUtils::getEvalFunc(in0,in1,op);
  IVar1 = in0->inputType;
  IVar2 = in1->inputType;
  deqp::gls::ShaderEvaluator::ShaderEvaluator(&(this->m_matEvaluator).super_ShaderEvaluator);
  (this->m_matEvaluator).super_ShaderEvaluator._vptr_ShaderEvaluator =
       (_func_int **)&PTR__ShaderEvaluator_00d20d80;
  (this->m_matEvaluator).m_matEvalFunc = p_Var4;
  (this->m_matEvaluator).m_inType0 = IVar1;
  (this->m_matEvaluator).m_inType1 = IVar2;
  return;
}

Assistant:

ShaderMatrixCase::ShaderMatrixCase (Context& context, const char* name, const char* desc, const ShaderInput& in0, const ShaderInput& in1, MatrixOp op, bool isVertexCase)
	: ShaderRenderCase	(context.getTestContext(), context.getRenderContext(), context.getContextInfo(), name, desc, isVertexCase, m_matEvaluator)
	, m_in0				(in0)
	, m_in1				(in1)
	, m_op				(op)
	, m_matEvaluator	(getEvalFunc(in0, in1, op), in0.inputType, in1.inputType)
{
}